

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O1

FT_Error raccess_guess_apple_single
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  FT_Error FVar1;
  
  *result_file_name = (char *)0x0;
  if (stream != (FT_Stream)0x0) {
    FVar1 = raccess_guess_apple_generic
                      ((FT_Library)stream,(FT_Stream)&DAT_00051600,(char *)result_offset,
                       (FT_Int32)result_file_name,result_offset);
    return FVar1;
  }
  return 0x51;
}

Assistant:

static FT_Error
  raccess_guess_apple_single( FT_Library  library,
                              FT_Stream   stream,
                              char       *base_file_name,
                              char      **result_file_name,
                              FT_Long    *result_offset )
  {
    FT_Int32  magic = ( 0x00 << 24 ) |
                      ( 0x05 << 16 ) |
                      ( 0x16 <<  8 ) |
                        0x00;


    *result_file_name = NULL;
    if ( NULL == stream )
      return FT_THROW( Cannot_Open_Stream );

    return raccess_guess_apple_generic( library, stream, base_file_name,
                                        magic, result_offset );
  }